

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

sexp_conflict
sexp_getgrnam_safe_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg2)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  int *in_RCX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict res4;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict res1;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  group **tmp4;
  group *tmp1;
  int err;
  group **result;
  size_t buflen;
  group *buf;
  group *grp;
  char *name;
  group local_68;
  void *local_48;
  void *local_40;
  int local_34;
  int *local_30;
  int *local_28;
  long local_18;
  long local_10;
  sexp_conflict local_8;
  
  local_34 = 0;
  local_68.gr_mem = (char **)0x43e;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_68.gr_passwd,0,0x10);
  local_68.gr_name = (char *)0x43e;
  memset(&stack0xffffffffffffff88,0,0x10);
  buf = (group *)0x43e;
  memset(&stack0xffffffffffffff70,0,0x10);
  if ((((ulong)local_28 & 3) == 0) && (*local_28 == 9)) {
    if ((((ulong)local_30 & 3) == 0) && (*local_30 == 9)) {
      local_68.gr_passwd = (char *)&local_68.gr_mem;
      local_68._16_8_ = *(undefined8 *)(local_10 + 0x6080);
      *(char ***)(local_10 + 0x6080) = &local_68.gr_passwd;
      grp = &local_68;
      name = *(char **)(local_10 + 0x6080);
      *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff88;
      result = (group **)&stack0xffffffffffffff80;
      buflen = *(size_t *)(local_10 + 0x6080);
      *(undefined1 **)(local_10 + 0x6080) = &stack0xffffffffffffff70;
      local_40 = calloc(1,0x21);
      local_48 = calloc(1,9);
      local_34 = getgrnam_safe(name,grp,(char *)buf,buflen,result);
      if (local_34 == 0) {
        auVar2._8_8_ = (long)*(ulong *)(local_18 + 0x38) >> 0x3f;
        auVar2._0_8_ = *(ulong *)(local_18 + 0x38) & 0xfffffffffffffffe;
        local_68.gr_name =
             (char *)sexp_make_cpointer(local_10,SUB168(auVar2 / SEXT816(2),0),local_40,local_30,1);
        uVar1 = *(ulong *)(*(long *)(local_18 + 0x48) + 0x18);
        auVar3._8_8_ = (long)uVar1 >> 0x3f;
        auVar3._0_8_ = uVar1 & 0xfffffffffffffffe;
        uVar4 = sexp_make_cpointer(local_10,SUB168(auVar3 / SEXT816(2),0),local_48,0x3e,1);
        local_68.gr_mem = (char **)0x23e;
        sexp_push_op(local_10,&local_68.gr_mem,uVar4);
        sexp_push_op(local_10,&local_68.gr_mem,local_68.gr_name);
      }
      else {
        local_68.gr_mem = (char **)0x3e;
      }
      *(undefined8 *)(local_10 + 0x6080) = local_68._16_8_;
      local_8 = (sexp_conflict)local_68.gr_mem;
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,9,local_30);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(local_10,local_18,9,local_28);
  }
  return local_8;
}

Assistant:

sexp sexp_getgrnam_safe_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg2) {
  int err = 0;
  struct group* tmp1;
  struct group* *tmp4;
  sexp_gc_var3(res, res1, res4);
  if (! sexp_stringp(arg0))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg0);
  if (! sexp_stringp(arg2))
    return sexp_type_exception(ctx, self, SEXP_STRING, arg2);
  sexp_gc_preserve3(ctx, res, res1, res4);
  tmp1 = (struct group*) calloc(1, 1 + sizeof(tmp1[0]));
  tmp4 = (struct group**) calloc(1, 1 + sizeof(tmp4[0]));
  err = getgrnam_safe(sexp_string_data(arg0), tmp1, sexp_string_data(arg2), sexp_string_size(arg2), tmp4);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res1 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg2_type(self)), tmp1, arg2, 1);
  res4 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_vector_ref(sexp_opcode_argn_type(self), SEXP_ONE)), tmp4, SEXP_FALSE, 1);
  res = SEXP_NULL;
  sexp_push(ctx, res, res4);
  sexp_push(ctx, res, res1);
  }
  sexp_gc_release3(ctx);
  return res;
}